

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void __thiscall nodecpp::log::LogTransport::~LogTransport(LogTransport *this)

{
  size_t sVar1;
  
  if (this->logData != (LogBufferBaseData *)0x0) {
    sVar1 = LogBufferBaseData::removeRef(this->logData);
    if ((sVar1 == 0) && (this->logData != (LogBufferBaseData *)0x0)) {
      LogBufferBaseData::deinit(this->logData);
    }
  }
  std::condition_variable::~condition_variable(&(this->gww).w);
  return;
}

Assistant:

~LogTransport()
		{
			if ( logData != nullptr )
			{
				size_t refCtr = logData->removeRef();
				if ( refCtr == 0 && logData != nullptr ) 
				{
					logData->deinit();
				}
			}
		}